

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::Scene(Scene *this,int materials_size,int textures_size,int objects_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  int i_2;
  int i_1;
  int i;
  int local_20;
  int local_1c;
  int local_18;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)(in_RDI + 3) = in_EDX;
  *(undefined4 *)(in_RDI + 5) = in_ECX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)in_RDI[1];
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *in_RDI = (long)pvVar5;
  for (local_18 = 0; local_18 < (int)in_RDI[1]; local_18 = local_18 + 1) {
    *(undefined8 *)(*in_RDI + (long)local_18 * 8) = 0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)in_RDI[3];
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  in_RDI[2] = (long)pvVar5;
  for (local_1c = 0; local_1c < (int)in_RDI[3]; local_1c = local_1c + 1) {
    *(undefined8 *)(in_RDI[2] + (long)local_1c * 8) = 0;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)in_RDI[5];
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  in_RDI[4] = (long)pvVar5;
  for (local_20 = 0; local_20 < (int)in_RDI[5]; local_20 = local_20 + 1) {
    *(undefined8 *)(in_RDI[4] + (long)local_20 * 8) = 0;
  }
  return;
}

Assistant:

Scene::Scene(int materials_size, int textures_size, int objects_size)
: m_materials_size(materials_size), m_textures_size(textures_size) , m_objects_size(objects_size)
{
    m_materials = new Material *[m_materials_size];
    for(int i=0; i<m_materials_size; ++i) {
        m_materials[i] = nullptr;
    }

    m_textures = new Texture *[m_textures_size];
    for(int i=0; i<m_textures_size; ++i) {
        m_textures[i] = nullptr;
    }

    m_objects = new Object *[m_objects_size];
    for(int i=0; i<m_objects_size; ++i) {
        m_objects[i] = nullptr;
    }
}